

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t get_path_component(char *name,size_t n,char *fn)

{
  wchar_t wVar1;
  char *pcVar2;
  size_t __n;
  
  pcVar2 = strchr((char *)n,0x2f);
  if (pcVar2 == (char *)0x0) {
    __n = strlen((char *)n);
    if (__n == 0) {
      return L'\0';
    }
  }
  else {
    __n = (long)pcVar2 - n;
  }
  wVar1 = L'\xffffffff';
  if (__n < 0x100) {
    memcpy(name,(void *)n,__n);
    name[__n] = '\0';
    wVar1 = (wchar_t)__n;
  }
  return wVar1;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}